

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O0

int Llb_ManMaxFanoutCi(Aig_Man_t *pAig)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_24;
  int local_20;
  int iInput;
  int WeightMax;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig_local;
  
  local_20 = -1000000000;
  local_24 = -1;
  for (iInput = 0; iVar1 = Vec_PtrSize(pAig->vCis), iInput < iVar1; iInput = iInput + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iInput);
    iVar1 = Aig_ObjRefs(pObj_00);
    if (local_20 < iVar1) {
      local_20 = Aig_ObjRefs(pObj_00);
      local_24 = iInput;
    }
  }
  if (local_24 < 0) {
    __assert_fail("iInput >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Hint.c"
                  ,0x37,"int Llb_ManMaxFanoutCi(Aig_Man_t *)");
  }
  return local_24;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns CI index with the largest number of fanouts.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManMaxFanoutCi( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj; 
    int i, WeightMax = -ABC_INFINITY, iInput = -1;
    Aig_ManForEachCi( pAig, pObj, i )
        if ( WeightMax < Aig_ObjRefs(pObj) )
        {
            WeightMax = Aig_ObjRefs(pObj);
            iInput = i;
        }
    assert( iInput >= 0 );
    return iInput;
}